

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImU32 ImHashData(void *data_p,size_t data_size,ImU32 seed)

{
  uint uVar1;
  size_t sVar2;
  uchar *data;
  
  if (data_size != 0) {
    uVar1 = ~seed;
    sVar2 = 0;
    do {
      uVar1 = uVar1 >> 8 ^ GCrc32LookupTable[(uint)*(byte *)((long)data_p + sVar2) ^ uVar1 & 0xff];
      sVar2 = sVar2 + 1;
    } while (data_size != sVar2);
    seed = ~uVar1;
  }
  return seed;
}

Assistant:

ImU32 ImHashData(const void* data_p, size_t data_size, ImU32 seed)
{
    ImU32 crc = ~seed;
    const unsigned char* data = (const unsigned char*)data_p;
    const ImU32* crc32_lut = GCrc32LookupTable;
    while (data_size-- != 0)
        crc = (crc >> 8) ^ crc32_lut[(crc & 0xFF) ^ *data++];
    return ~crc;
}